

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SetBuilder.h
# Opt level: O0

bool __thiscall
Refal2::CSetBuilder<unsigned_int>::Export
          (CSetBuilder<unsigned_int> *this,CFastSet<unsigned_int> *exportTo)

{
  bool bVar1;
  bool local_21;
  CFastSet<unsigned_int> *exportTo_local;
  CSetBuilder<unsigned_int> *this_local;
  
  local_21 = false;
  if (this->fullSetStatus != S_Thru) {
    local_21 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::empty
                         (&this->thru);
  }
  if (local_21 == false) {
    __assert_fail("fullSetStatus != S_Thru && thru.empty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/cmc-msu-ai[P]refal/include/SetBuilder.h"
                  ,0x38,
                  "bool Refal2::CSetBuilder<unsigned int>::Export(CFastSet<T> &) [T = unsigned int]"
                 );
  }
  bVar1 = this->fullSetStatus != S_Yes;
  if (bVar1) {
    CFastSet<unsigned_int>::operator=(exportTo,&this->yes);
  }
  else {
    CFastSet<unsigned_int>::operator=(exportTo,&this->no);
  }
  this_local._7_1_ = !bVar1;
  return this_local._7_1_;
}

Assistant:

bool CSetBuilder<T>::Export( CFastSet<T>& exportTo )
{
	assert( fullSetStatus != S_Thru && thru.empty() );
	if( fullSetStatus == S_Yes ) {
		exportTo = no;
		return true;
	} else {
		exportTo = yes;
		return false;
	}
}